

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_pspr.cpp
# Opt level: O2

void P_FireWeapon(player_t *player,FState *state)

{
  AWeapon *this;
  bool bVar1;
  DBot *pDVar2;
  
  pDVar2 = GC::ReadBarrier<DBot>((DBot **)&player->Bot);
  if (((pDVar2 != (DBot *)0x0) || (bot_observer.Value == false)) &&
     (this = player->ReadyWeapon, this != (AWeapon *)0x0)) {
    bVar1 = AWeapon::CheckAmmo(this,0,true,false,-1);
    if (bVar1) {
      APlayerPawn::PlayAttacking(player->mo);
      this->bAltFire = false;
      if (state == (FState *)0x0) {
        state = AWeapon::GetAtkState(this,player->refire != 0);
      }
      P_SetPsprite(player,PSP_WEAPON,state,false);
      if (((this->super_AStateProvider).super_AInventory.field_0x4fc & 0x10) == 0) {
        P_NoiseAlert(&player->mo->super_AActor,&player->mo->super_AActor,false,0.0);
        return;
      }
    }
  }
  return;
}

Assistant:

void P_FireWeapon (player_t *player, FState *state)
{
	AWeapon *weapon;

	// [SO] 9/2/02: People were able to do an awful lot of damage
	// when they were observers...
	if (player->Bot == nullptr && bot_observer)
	{
		return;
	}

	weapon = player->ReadyWeapon;
	if (weapon == nullptr || !weapon->CheckAmmo (AWeapon::PrimaryFire, true))
	{
		return;
	}

	player->mo->PlayAttacking ();
	weapon->bAltFire = false;
	if (state == nullptr)
	{
		state = weapon->GetAtkState(!!player->refire);
	}
	P_SetPsprite(player, PSP_WEAPON, state);
	if (!(weapon->WeaponFlags & WIF_NOALERT))
	{
		P_NoiseAlert (player->mo, player->mo, false);
	}
}